

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionState.h
# Opt level: O0

bool __thiscall FIX::SessionState::needHeartbeat(SessionState *this,UtcTimeStamp *now)

{
  int iVar1;
  int iVar2;
  DateTime *rhs;
  IntField *this_00;
  undefined1 local_19;
  UtcTimeStamp *now_local;
  SessionState *this_local;
  
  rhs = &lastSentTime(this)->super_DateTime;
  iVar1 = FIX::operator-(&now->super_DateTime,rhs);
  this_00 = &heartBtInt(this)->super_IntField;
  iVar2 = IntField::operator_cast_to_int(this_00);
  local_19 = 0;
  if (iVar2 <= iVar1) {
    iVar1 = testRequest(this);
    local_19 = iVar1 != 0 ^ 0xff;
  }
  return (bool)(local_19 & 1);
}

Assistant:

bool needHeartbeat(const UtcTimeStamp &now) const {
    return ((now - lastSentTime()) >= heartBtInt()) && !testRequest();
  }